

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsInter.c
# Opt level: O3

sat_solver * Abc_MfsCreateSolverResub(Mfs_Man_t *p,int *pCands,int nCands,int fInvert)

{
  Aig_Man_t *pAVar1;
  int **ppiVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  undefined8 in_RAX;
  Vec_Ptr_t *pVVar6;
  sat_solver *s;
  Cnf_Dat_t *pCVar7;
  int iVar8;
  Vec_Int_t *pVVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  int Lits [2];
  undefined8 local_38;
  
  pAVar1 = p->pAigWin;
  uVar5 = p->vDivs->nSize;
  uVar11 = ~uVar5 + pAVar1->nObjs[3];
  local_38 = in_RAX;
  if (-1 < (int)uVar11) {
    pVVar6 = pAVar1->vCos;
    iVar4 = pVVar6->nSize;
    if ((int)uVar11 < iVar4) {
      local_38._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
      local_38 = CONCAT44(local_38._4_4_,
                          (uint)(fInvert != 0) +
                          p->pCnf->pVarNums[*(int *)((long)pVVar6->pArray[uVar11] + 0x24)] * 2);
      p->vProjVarsCnf->nSize = 0;
      uVar13 = pAVar1->nObjs[3] - uVar5;
      uVar11 = 0;
      if ((int)uVar13 < iVar4) {
        uVar12 = (ulong)uVar13;
        do {
          if ((int)uVar13 < 0) goto LAB_0044c519;
          iVar4 = p->pCnf->pVarNums[*(int *)((long)pVVar6->pArray[uVar12] + 0x24)];
          if (iVar4 < 0) {
            __assert_fail("p->pCnf->pVarNums[pObjPo->Id] >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsInter.c"
                          ,0x66,"sat_solver *Abc_MfsCreateSolverResub(Mfs_Man_t *, int *, int, int)"
                         );
          }
          Vec_IntPush(p->vProjVarsCnf,iVar4);
          uVar12 = uVar12 + 1;
          pVVar6 = p->pAigWin->vCos;
        } while ((int)uVar12 < pVVar6->nSize);
        uVar11 = p->vProjVarsCnf->nSize;
        uVar5 = p->vDivs->nSize;
      }
      if (uVar11 != uVar5) {
        __assert_fail("Vec_IntSize(p->vProjVarsCnf) == Vec_PtrSize(p->vDivs)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsInter.c"
                      ,0x69,"sat_solver *Abc_MfsCreateSolverResub(Mfs_Man_t *, int *, int, int)");
      }
      s = sat_solver_new();
      sat_solver_setnvars(s,p->pCnf->nVars * 2 + p->vDivs->nSize);
      if (pCands != (int *)0x0) {
        sat_solver_store_alloc(s);
      }
      lVar10 = 0;
      while (lVar10 < p->pCnf->nClauses) {
        ppiVar2 = p->pCnf->pClauses;
        iVar4 = sat_solver_addclause(s,ppiVar2[lVar10],ppiVar2[lVar10 + 1]);
        lVar10 = lVar10 + 1;
        if (iVar4 == 0) goto LAB_0044c4fc;
      }
      iVar4 = sat_solver_addclause(s,(lit *)&local_38,(lit *)((long)&local_38 + 4));
      if (iVar4 == 0) goto LAB_0044c4fc;
      if (p->pPars->fOneHotness != 0) {
        p->pSat = s;
        iVar4 = Abc_NtkAddOneHotness(p);
        if (iVar4 == 0) {
          return (sat_solver *)0x0;
        }
        p->pSat = (sat_solver *)0x0;
      }
      if (pCands != (int *)0x0) {
        sat_solver_store_mark_clauses_a(s);
      }
      pCVar7 = p->pCnf;
      if (0 < pCVar7->nLiterals) {
        piVar3 = *pCVar7->pClauses;
        lVar10 = 0;
        do {
          piVar3[lVar10] = piVar3[lVar10] + pCVar7->nVars * 2;
          lVar10 = lVar10 + 1;
        } while (lVar10 < pCVar7->nLiterals);
      }
      lVar10 = 0;
      while (pCVar7 = p->pCnf, lVar10 < pCVar7->nClauses) {
        iVar4 = sat_solver_addclause(s,pCVar7->pClauses[lVar10],pCVar7->pClauses[lVar10 + 1]);
        lVar10 = lVar10 + 1;
        if (iVar4 == 0) goto LAB_0044c4fc;
      }
      if (p->pPars->fOneHotness != 0) {
        p->pSat = s;
        iVar4 = Abc_NtkAddOneHotness(p);
        if (iVar4 == 0) {
          return (sat_solver *)0x0;
        }
        p->pSat = (sat_solver *)0x0;
        pCVar7 = p->pCnf;
      }
      if (0 < pCVar7->nLiterals) {
        piVar3 = *pCVar7->pClauses;
        lVar10 = 0;
        do {
          piVar3[lVar10] = piVar3[lVar10] + pCVar7->nVars * -2;
          lVar10 = lVar10 + 1;
        } while (lVar10 < pCVar7->nLiterals);
      }
      local_38 = CONCAT44(local_38._4_4_,((uint)local_38 ^ 1) + pCVar7->nVars * 2);
      iVar4 = sat_solver_addclause(s,(lit *)&local_38,(lit *)((long)&local_38 + 4));
      if (iVar4 != 0) {
        if (pCands == (int *)0x0) {
          p->vProjVarsSat->nSize = 0;
          pVVar9 = p->vProjVarsCnf;
          iVar4 = pVVar9->nSize;
          if (iVar4 < 1) {
            iVar8 = 0;
          }
          else {
            lVar10 = 0;
            do {
              iVar4 = p->pCnf->nVars;
              iVar4 = Abc_MfsSatAddXor(s,pVVar9->pArray[lVar10],iVar4 + pVVar9->pArray[lVar10],
                                       (int)lVar10 + iVar4 * 2);
              if (iVar4 == 0) goto LAB_0044c4fc;
              Vec_IntPush(p->vProjVarsSat,(int)lVar10 + p->pCnf->nVars * 2);
              lVar10 = lVar10 + 1;
              pVVar9 = p->vProjVarsCnf;
              iVar4 = pVVar9->nSize;
            } while (lVar10 < iVar4);
            iVar8 = p->vProjVarsSat->nSize;
          }
          if (iVar4 != iVar8) {
            __assert_fail("Vec_IntSize(p->vProjVarsCnf) == Vec_IntSize(p->vProjVarsSat)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsInter.c"
                          ,0xd3,"sat_solver *Abc_MfsCreateSolverResub(Mfs_Man_t *, int *, int, int)"
                         );
          }
          iVar4 = sat_solver_simplify(s);
          if (iVar4 != 0) {
            return s;
          }
        }
        else {
          if (nCands < 1) {
LAB_0044c46a:
            sat_solver_store_mark_roots(s);
            return s;
          }
          uVar12 = (ulong)(uint)nCands;
          while( true ) {
            iVar4 = p->pCnf->nVars;
            uVar5 = (*pCands >> 1) + iVar4 * -2;
            if (((int)uVar5 < 0) || (p->vProjVarsCnf->nSize <= (int)uVar5)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar8 = p->vProjVarsCnf->pArray[uVar5];
            iVar4 = Abc_MfsSatAddXor(s,iVar8,iVar4 + iVar8,*pCands >> 1);
            if (iVar4 == 0) break;
            iVar4 = sat_solver_addclause(s,pCands,pCands + 1);
            if (iVar4 == 0) break;
            uVar12 = uVar12 - 1;
            pCands = pCands + 1;
            if (uVar12 == 0) goto LAB_0044c46a;
          }
        }
      }
LAB_0044c4fc:
      sat_solver_delete(s);
      return (sat_solver *)0x0;
    }
  }
LAB_0044c519:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

sat_solver * Abc_MfsCreateSolverResub( Mfs_Man_t * p, int * pCands, int nCands, int fInvert )
{
    sat_solver * pSat;
    Aig_Obj_t * pObjPo;
    int Lits[2], status, iVar, i, c;

    // get the literal for the output of F
    pObjPo = Aig_ManCo( p->pAigWin, Aig_ManCoNum(p->pAigWin) - Vec_PtrSize(p->vDivs) - 1 );
    Lits[0] = toLitCond( p->pCnf->pVarNums[pObjPo->Id], fInvert );

    // collect the outputs of the divisors
    Vec_IntClear( p->vProjVarsCnf );
    Vec_PtrForEachEntryStart( Aig_Obj_t *, p->pAigWin->vCos, pObjPo, i, Aig_ManCoNum(p->pAigWin) - Vec_PtrSize(p->vDivs) )
    {
        assert( p->pCnf->pVarNums[pObjPo->Id] >= 0 );
        Vec_IntPush( p->vProjVarsCnf, p->pCnf->pVarNums[pObjPo->Id] );
    }
    assert( Vec_IntSize(p->vProjVarsCnf) == Vec_PtrSize(p->vDivs) );

    // start the solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, 2 * p->pCnf->nVars + Vec_PtrSize(p->vDivs) );
    if ( pCands )
        sat_solver_store_alloc( pSat );

    // load the first copy of the clauses
    for ( i = 0; i < p->pCnf->nClauses; i++ )
    {
        if ( !sat_solver_addclause( pSat, p->pCnf->pClauses[i], p->pCnf->pClauses[i+1] ) )
        {
            sat_solver_delete( pSat );
            return NULL;
        }
    }
    // add the clause for the first output of F
    if ( !sat_solver_addclause( pSat, Lits, Lits+1 ) )
    {
        sat_solver_delete( pSat );
        return NULL;
    }

    // add one-hotness constraints
    if ( p->pPars->fOneHotness )
    {
        p->pSat = pSat;
        if ( !Abc_NtkAddOneHotness( p ) )
            return NULL;
        p->pSat = NULL;
    }

    // bookmark the clauses of A
    if ( pCands )
        sat_solver_store_mark_clauses_a( pSat );

    // transform the literals
    for ( i = 0; i < p->pCnf->nLiterals; i++ )
        p->pCnf->pClauses[0][i] += 2 * p->pCnf->nVars;
    // load the second copy of the clauses
    for ( i = 0; i < p->pCnf->nClauses; i++ )
    {
        if ( !sat_solver_addclause( pSat, p->pCnf->pClauses[i], p->pCnf->pClauses[i+1] ) )
        {
            sat_solver_delete( pSat );
            return NULL;
        }
    }
    // add one-hotness constraints
    if ( p->pPars->fOneHotness )
    {
        p->pSat = pSat;
        if ( !Abc_NtkAddOneHotness( p ) )
            return NULL;
        p->pSat = NULL;
    }
    // transform the literals
    for ( i = 0; i < p->pCnf->nLiterals; i++ )
        p->pCnf->pClauses[0][i] -= 2 * p->pCnf->nVars;
    // add the clause for the second output of F
    Lits[0] = 2 * p->pCnf->nVars + lit_neg( Lits[0] );
    if ( !sat_solver_addclause( pSat, Lits, Lits+1 ) )
    {
        sat_solver_delete( pSat );
        return NULL;
    }

    if ( pCands )
    {
        // add relevant clauses for EXOR gates
        for ( c = 0; c < nCands; c++ )
        {
            // get the variable number of this divisor
            i = lit_var( pCands[c] ) - 2 * p->pCnf->nVars;
            // get the corresponding SAT variable
            iVar = Vec_IntEntry( p->vProjVarsCnf, i );
            // add the corresponding EXOR gate
            if ( !Abc_MfsSatAddXor( pSat, iVar, iVar + p->pCnf->nVars, 2 * p->pCnf->nVars + i ) )
            {
                sat_solver_delete( pSat );
                return NULL;
            }
            // add the corresponding clause
            if ( !sat_solver_addclause( pSat, pCands + c, pCands + c + 1 ) )
            {
                sat_solver_delete( pSat );
                return NULL;
            }
        }
        // bookmark the roots
        sat_solver_store_mark_roots( pSat );
    }
    else
    {
        // add the clauses for the EXOR gates - and remember their outputs
        Vec_IntClear( p->vProjVarsSat );
        Vec_IntForEachEntry( p->vProjVarsCnf, iVar, i )
        {
            if ( !Abc_MfsSatAddXor( pSat, iVar, iVar + p->pCnf->nVars, 2 * p->pCnf->nVars + i ) )
            {
                sat_solver_delete( pSat );
                return NULL;
            }
            Vec_IntPush( p->vProjVarsSat, 2 * p->pCnf->nVars + i );
        }
        assert( Vec_IntSize(p->vProjVarsCnf) == Vec_IntSize(p->vProjVarsSat) );
        // simplify the solver
        status = sat_solver_simplify(pSat);
        if ( status == 0 )
        {
//            printf( "Abc_MfsCreateSolverResub(): SAT solver construction has failed. Skipping node.\n" );
            sat_solver_delete( pSat );
            return NULL;
        }
    }
    return pSat;
}